

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

bool __thiscall
gl3cts::PerVertexValidationTest::isShaderProgramLinkingFailureExpected
          (PerVertexValidationTest *this,_test_iteration iteration)

{
  return iteration == TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED || (int)iteration < 0x1c;
}

Assistant:

bool PerVertexValidationTest::isShaderProgramLinkingFailureExpected(_test_iteration iteration) const
{
	/** All "undeclared in.." and "undeclared out.." test shaders are expected not to link successfully
	 *  when used as separate programs.
	 *  Shaders built as a part of the remaining test iterations should compile and link successfully
	 *  for separate programs implementing only a single shader stage. Later on, however, pipeline
	 *  objects built of these programs should fail to validate, as they use incompatible gl_PerVertex
	 *  block redeclarations.
	 */
	return (iteration < TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_VS) ||
		   iteration == TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED;
}